

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O3

void __thiscall
ser::CentralizedFileFormat::GlobalInfoFromJSON(CentralizedFileFormat *this,JSONNode *node)

{
  internalJSONNode *piVar1;
  JSONNode **ppJVar2;
  JSONNode **ppJVar3;
  
  piVar1 = node->internal;
  if ((piVar1->_type & 0xfe) == 4) {
    internalJSONNode::Fetch(piVar1);
    ppJVar3 = piVar1->Children->array;
  }
  else {
    ppJVar3 = (JSONNode **)0x0;
  }
  while( true ) {
    piVar1 = node->internal;
    if ((piVar1->_type & 0xfe) == 4) {
      internalJSONNode::Fetch(piVar1);
      ppJVar2 = piVar1->Children->array + piVar1->Children->mysize;
    }
    else {
      ppJVar2 = (JSONNode **)0x0;
    }
    if (ppJVar3 == ppJVar2) break;
    MetainfoSet::AddNode((this->super_FileFormat).pGlobalMetainfo_,*ppJVar3);
    ppJVar3 = ppJVar3 + 1;
  }
  return;
}

Assistant:

void CentralizedFileFormat::GlobalInfoFromJSON(const JSONNode& node)
{
    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
            pGlobalMetainfo_->AddNode(*iter);
}